

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.h
# Opt level: O1

string * __thiscall
PlayerStrategy::getStrategyName_abi_cxx11_(string *__return_storage_ptr__,PlayerStrategy *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = this->strategyName;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar1->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string getStrategyName() const { return *strategyName; }